

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

void Fra_SmlNodeTransferNext(Fra_Sml_t *p,Aig_Obj_t *pOut,Aig_Obj_t *pIn,int iFrame)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  if (((ulong)pOut & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pOut)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x269,"void Fra_SmlNodeTransferNext(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int)")
    ;
  }
  if (((ulong)pIn & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pIn)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x26a,"void Fra_SmlNodeTransferNext(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int)")
    ;
  }
  if ((*(uint *)&pOut->field_0x18 & 7) != 3) {
    __assert_fail("Aig_ObjIsCo(pOut)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x26b,"void Fra_SmlNodeTransferNext(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int)")
    ;
  }
  if ((*(uint *)&pIn->field_0x18 & 7) == 2) {
    if ((iFrame != 0) && (p->nWordsTotal <= p->nWordsFrame)) {
      __assert_fail("iFrame == 0 || p->nWordsFrame < p->nWordsTotal",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x26d,
                    "void Fra_SmlNodeTransferNext(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
    }
    iVar1 = p->nWordsFrame;
    if (0 < iVar1) {
      iVar2 = p->nWordsTotal;
      iVar3 = pIn->Id;
      iVar4 = pOut->Id;
      lVar5 = 0;
      do {
        *(undefined4 *)
         ((long)&p[1].pAig +
         lVar5 * 4 + (long)((iFrame + 1) * iVar1) * 4 + (long)(iVar3 * iVar2) * 4) =
             *(undefined4 *)
              ((long)&p[1].pAig + lVar5 * 4 + (long)(iVar1 * iFrame) * 4 + (long)(iVar2 * iVar4) * 4
              );
        lVar5 = lVar5 + 1;
      } while (lVar5 < p->nWordsFrame);
    }
    return;
  }
  __assert_fail("Aig_ObjIsCi(pIn)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                ,0x26c,"void Fra_SmlNodeTransferNext(Fra_Sml_t *, Aig_Obj_t *, Aig_Obj_t *, int)");
}

Assistant:

void Fra_SmlNodeTransferNext( Fra_Sml_t * p, Aig_Obj_t * pOut, Aig_Obj_t * pIn, int iFrame )
{
    unsigned * pSims0, * pSims1;
    int i;
    assert( !Aig_IsComplement(pOut) );
    assert( !Aig_IsComplement(pIn) );
    assert( Aig_ObjIsCo(pOut) );
    assert( Aig_ObjIsCi(pIn) );
    assert( iFrame == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims0 = Fra_ObjSim(p, pOut->Id) + p->nWordsFrame * iFrame;
    pSims1 = Fra_ObjSim(p, pIn->Id) + p->nWordsFrame * (iFrame+1);
    // copy information as it is
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims1[i] = pSims0[i];
}